

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall
lunasvg::SVGPreserveAspectRatio::parse(SVGPreserveAspectRatio *this,string_view input)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  MeetOrSlice MVar4;
  string_view input_local;
  string_view local_38;
  
  input_local._M_str = input._M_str;
  input_local._M_len = input._M_len;
  stripLeadingSpaces(&input_local);
  local_38._M_len = 4;
  local_38._M_str = "none";
  bVar1 = skipString(&input_local,&local_38);
  MVar4 = Meet;
  uVar3 = 0;
  if (!bVar1) {
    local_38._M_len = 8;
    local_38._M_str = "xMinYMin";
    bVar2 = skipString(&input_local,&local_38);
    if (bVar2) {
      uVar3 = 1;
    }
    else {
      local_38._M_len = 8;
      local_38._M_str = "xMidYMin";
      bVar2 = skipString(&input_local,&local_38);
      if (bVar2) {
        uVar3 = 2;
      }
      else {
        local_38._M_len = 8;
        local_38._M_str = "xMaxYMin";
        bVar2 = skipString(&input_local,&local_38);
        if (bVar2) {
          uVar3 = 3;
        }
        else {
          local_38._M_len = 8;
          local_38._M_str = "xMinYMid";
          bVar2 = skipString(&input_local,&local_38);
          if (bVar2) {
            uVar3 = 4;
          }
          else {
            local_38._M_len = 8;
            local_38._M_str = "xMidYMid";
            bVar2 = skipString(&input_local,&local_38);
            if (bVar2) {
              uVar3 = 5;
            }
            else {
              local_38._M_len = 8;
              local_38._M_str = "xMaxYMid";
              bVar2 = skipString(&input_local,&local_38);
              if (bVar2) {
                uVar3 = 6;
              }
              else {
                local_38._M_len = 8;
                local_38._M_str = "xMinYMax";
                bVar2 = skipString(&input_local,&local_38);
                if (bVar2) {
                  uVar3 = 7;
                }
                else {
                  local_38._M_len = 8;
                  local_38._M_str = "xMidYMax";
                  bVar2 = skipString(&input_local,&local_38);
                  if (bVar2) {
                    uVar3 = 8;
                  }
                  else {
                    local_38._M_len = 8;
                    local_38._M_str = "xMaxYMax";
                    bVar2 = skipString(&input_local,&local_38);
                    if (!bVar2) {
                      return false;
                    }
                    uVar3 = 9;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  skipOptionalSpaces(&input_local);
  local_38._M_len = 4;
  local_38._M_str = "meet";
  bVar2 = skipString(&input_local,&local_38);
  if (!bVar2) {
    local_38._M_len = 5;
    local_38._M_str = "slice";
    bVar2 = skipString(&input_local,&local_38);
    MVar4 = (MeetOrSlice)bVar2;
  }
  skipOptionalSpaces(&input_local);
  bVar2 = false;
  if (input_local._M_len == 0) {
    if (bVar1) {
      MVar4 = Meet;
    }
    *(undefined4 *)&(this->super_SVGProperty).field_0xc = uVar3;
    this->m_meetOrSlice = MVar4;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SVGPreserveAspectRatio::parse(std::string_view input)
{
    auto alignType = AlignType::xMidYMid;
    stripLeadingSpaces(input);
    if(skipString(input, "none"))
        alignType = AlignType::None;
    else if(skipString(input, "xMinYMin"))
        alignType = AlignType::xMinYMin;
    else if(skipString(input, "xMidYMin"))
        alignType = AlignType::xMidYMin;
    else if(skipString(input, "xMaxYMin"))
        alignType = AlignType::xMaxYMin;
    else if(skipString(input, "xMinYMid"))
        alignType = AlignType::xMinYMid;
    else if(skipString(input, "xMidYMid"))
        alignType = AlignType::xMidYMid;
    else if(skipString(input, "xMaxYMid"))
        alignType = AlignType::xMaxYMid;
    else if(skipString(input, "xMinYMax"))
        alignType = AlignType::xMinYMax;
    else if(skipString(input, "xMidYMax"))
        alignType = AlignType::xMidYMax;
    else if(skipString(input, "xMaxYMax"))
        alignType = AlignType::xMaxYMax;
    else {
        return false;
    }

    auto meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(skipString(input, "meet")) {
        meetOrSlice = MeetOrSlice::Meet;
    } else if(skipString(input, "slice")) {
        meetOrSlice = MeetOrSlice::Slice;
    }

    if(alignType == AlignType::None)
        meetOrSlice = MeetOrSlice::Meet;
    skipOptionalSpaces(input);
    if(!input.empty())
        return false;
    m_alignType = alignType;
    m_meetOrSlice = meetOrSlice;
    return true;
}